

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

string * __thiscall
duckdb::Exception::ConstructMessage<unsigned_long,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,unsigned_long params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  string local_58;
  string local_38 [32];
  
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  ::std::__cxx11::string::string(local_38,(string *)params);
  ConstructMessageRecursive<unsigned_long,std::__cxx11::string>
            (__return_storage_ptr__,this,&local_58,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,(unsigned_long)local_38,in_R9);
  ::std::__cxx11::string::~string(local_38);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &local_58);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}